

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benmark2.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  pointer ptVar1;
  bool bVar2;
  uint uVar3;
  ThreadPool *this;
  allocator<char> local_199;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_198;
  allocator<char> local_171;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  allocator<char> local_149;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  ThreadPool *local_128;
  ThreadPool *t;
  undefined4 local_118;
  int i;
  undefined1 local_108 [8];
  ThreadPool pool;
  char *mode;
  uint threadCount;
  int count;
  char **argv_local;
  int argc_local;
  
  signal(0xd,(__sighandler_t)0x1);
  mode._4_4_ = 0;
  std::thread::hardware_concurrency();
  pool.threads_.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)argv[2];
  if (argc < 3) {
    printf("usage benmark threadCount both|server|client clientcount packetSize\n");
    return 0;
  }
  uVar3 = atoi(argv[1]);
  if (3 < argc) {
    mode._4_4_ = atoi(argv[3]);
  }
  if (4 < argc) {
    packetSize = atoi(argv[4]);
  }
  printf("threadCount:%d\n",(ulong)uVar3);
  hwnet::ThreadPool::ThreadPool((ThreadPool *)local_108);
  hwnet::ThreadPool::Init((ThreadPool *)local_108,1,0);
  bVar2 = hwnet::Poller::Init(&poller_,(ThreadPool *)local_108);
  if (bVar2) {
    for (t._4_4_ = 0;
        ptVar1 = pool.threads_.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl
                 .super__Vector_impl_data._M_end_of_storage, t._4_4_ < (int)uVar3;
        t._4_4_ = t._4_4_ + 1) {
      this = (ThreadPool *)operator_new(0xe0);
      hwnet::ThreadPool::ThreadPool(this);
      local_128 = this;
      hwnet::ThreadPool::Init(this,1,1);
      std::vector<hwnet::ThreadPool_*,_std::allocator<hwnet::ThreadPool_*>_>::push_back
                (&pools,&local_128);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_148,"both",&local_149);
    bVar2 = std::operator==((char *)ptVar1,&local_148);
    std::__cxx11::string::~string((string *)&local_148);
    std::allocator<char>::~allocator(&local_149);
    ptVar1 = pool.threads_.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
    if (bVar2) {
      server();
      client(mode._4_4_);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_170,"server",&local_171);
      bVar2 = std::operator==((char *)ptVar1,&local_170);
      std::__cxx11::string::~string((string *)&local_170);
      std::allocator<char>::~allocator(&local_171);
      ptVar1 = pool.threads_.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
      if (bVar2) {
        server();
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_198,"client",&local_199)
        ;
        bVar2 = std::operator==((char *)ptVar1,&local_198);
        std::__cxx11::string::~string((string *)&local_198);
        std::allocator<char>::~allocator(&local_199);
        if (!bVar2) {
          printf("usage benmark threadCount both|server|client clientcount packetSize\n");
          goto LAB_0013cc3b;
        }
        client(mode._4_4_);
      }
    }
    hwnet::Poller::Run(&poller_);
    printf("program end\n");
  }
  else {
    printf("init failed\n");
  }
LAB_0013cc3b:
  local_118 = 1;
  hwnet::ThreadPool::~ThreadPool((ThreadPool *)local_108);
  return 0;
}

Assistant:

int main(int argc,char **argv) {

	signal(SIGPIPE,SIG_IGN);

	auto count = 0;
	auto threadCount = std::thread::hardware_concurrency();

	auto mode = argv[2];

	if(argc < 3) {
		printf("usage benmark threadCount both|server|client clientcount packetSize\n");
		return 0;
	}

	threadCount = ::atoi(argv[1]);

	if(argc > 3) {
		count = ::atoi(argv[3]);
	}

	if(argc > 4) {
		packetSize = ::atoi(argv[4]);
	}

	printf("threadCount:%d\n",threadCount);
	
	ThreadPool pool;
	pool.Init(1);

	if(!poller_.Init(&pool)) {
		printf("init failed\n");
		return 0;
	}


	//每个pool只有一个线程，因此TCPSocket被绑定到单一线程上
	for(int i = 0; i < int(threadCount); i++) {
		ThreadPool *t = new ThreadPool();
		t->Init(1,ThreadPool::SwapMode);
		pools.push_back(t);
	}


	if(mode == std::string("both")) {
		server();
		client(count);
	} else if(mode == std::string("server")) {
		server();
	} else if(mode == std::string("client")) {
		client(count);
	} else {
		printf("usage benmark threadCount both|server|client clientcount packetSize\n");
		return 0;		
	}

	poller_.Run();

	printf("program end\n");

	return 0;
}